

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# elfio_dump.hpp
# Opt level: O1

void ELFIO::dump::section_header(ostream *out,Elf_Half no,section *sec,uchar elf_class)

{
  undefined4 uVar1;
  long lVar2;
  long lVar3;
  ostream oVar4;
  int iVar5;
  ostream *poVar6;
  ostream *poVar7;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  undefined7 in_register_00000009;
  uint *puVar8;
  Elf_Xword flags;
  Elf_Xword flags_00;
  string local_90;
  long *local_70;
  long local_68;
  long local_60 [2];
  string local_50;
  
  uVar1 = *(undefined4 *)(out + *(long *)(*(long *)out + -0x18) + 0x18);
  std::__ostream_insert<char,std::char_traits<char>>(out,"[",1);
  lVar2 = *(long *)out;
  *(undefined8 *)(out + *(long *)(lVar2 + -0x18) + 0x10) = 5;
  lVar2 = *(long *)(lVar2 + -0x18);
  poVar7 = out + lVar2;
  if ((int)CONCAT71(in_register_00000009,elf_class) == 1) {
    if (out[lVar2 + 0xe1] == (ostream)0x0) {
      oVar4 = (ostream)std::ios::widen((char)poVar7);
      poVar7[0xe0] = oVar4;
      poVar7[0xe1] = (ostream)0x1;
    }
    poVar7[0xe0] = (ostream)0x20;
    lVar2 = *(long *)out;
    lVar3 = *(long *)(lVar2 + -0x18);
    *(uint *)(out + lVar3 + 0x18) = *(uint *)(out + lVar3 + 0x18) & 0xffffffb5 | 2;
    lVar2 = *(long *)(lVar2 + -0x18);
    *(uint *)(out + lVar2 + 0x18) = *(uint *)(out + lVar2 + 0x18) & 0xffffff4f | 0x80;
    poVar6 = std::ostream::_M_insert<unsigned_long>((ulong)out);
    std::__ostream_insert<char,std::char_traits<char>>(poVar6,"] ",2);
    lVar2 = *(long *)poVar6;
    *(undefined8 *)(poVar6 + *(long *)(lVar2 + -0x18) + 0x10) = 0x11;
    lVar2 = *(long *)(lVar2 + -0x18);
    poVar7 = poVar6 + lVar2;
    if (poVar6[lVar2 + 0xe1] == (ostream)0x0) {
      oVar4 = (ostream)std::ios::widen((char)poVar7);
      poVar7[0xe0] = oVar4;
      poVar7[0xe1] = (ostream)0x1;
    }
    poVar7[0xe0] = (ostream)0x20;
    lVar2 = *(long *)poVar6;
    puVar8 = *(uint **)(lVar2 + -0x18);
    *(uint *)(poVar6 + 0x18 + (long)puVar8) =
         *(uint *)(poVar6 + 0x18 + (long)puVar8) & 0xffffffb5 | 8;
    lVar2 = *(long *)(lVar2 + -0x18);
    *(uint *)(poVar6 + lVar2 + 0x18) = *(uint *)(poVar6 + lVar2 + 0x18) & 0xffffff4f | 0x20;
    local_90._M_dataplus._M_p._0_4_ = (*sec->_vptr_section[5])(sec);
    format_assoc<ELFIO::section_type_table_t[33],unsigned_int>
              (&local_50,(dump *)section_type_table,(section_type_table_t (*) [33])&local_90,puVar8)
    ;
    poVar7 = std::__ostream_insert<char,std::char_traits<char>>
                       (poVar6,local_50._M_dataplus._M_p,local_50._M_string_length);
    std::__ostream_insert<char,std::char_traits<char>>(poVar7," ",1);
    std::__ostream_insert<char,std::char_traits<char>>(poVar7,"0x",2);
    lVar2 = *(long *)poVar7;
    *(undefined8 *)(poVar7 + *(long *)(lVar2 + -0x18) + 0x10) = 8;
    lVar2 = *(long *)(lVar2 + -0x18);
    poVar6 = poVar7 + lVar2;
    if (poVar7[lVar2 + 0xe1] == (ostream)0x0) {
      oVar4 = (ostream)std::ios::widen((char)poVar6);
      poVar6[0xe0] = oVar4;
      poVar6[0xe1] = (ostream)0x1;
    }
    poVar6[0xe0] = (ostream)0x30;
    lVar2 = *(long *)poVar7;
    lVar3 = *(long *)(lVar2 + -0x18);
    *(uint *)(poVar7 + lVar3 + 0x18) = *(uint *)(poVar7 + lVar3 + 0x18) & 0xffffffb5 | 8;
    lVar2 = *(long *)(lVar2 + -0x18);
    *(uint *)(poVar7 + lVar2 + 0x18) = *(uint *)(poVar7 + lVar2 + 0x18) & 0xffffff4f | 0x80;
    (*sec->_vptr_section[0x11])(sec);
    poVar7 = std::ostream::_M_insert<unsigned_long>((ulong)poVar7);
    std::__ostream_insert<char,std::char_traits<char>>(poVar7," ",1);
    std::__ostream_insert<char,std::char_traits<char>>(poVar7,"0x",2);
    lVar2 = *(long *)poVar7;
    *(undefined8 *)(poVar7 + *(long *)(lVar2 + -0x18) + 0x10) = 8;
    lVar2 = *(long *)(lVar2 + -0x18);
    poVar6 = poVar7 + lVar2;
    if (poVar7[lVar2 + 0xe1] == (ostream)0x0) {
      oVar4 = (ostream)std::ios::widen((char)poVar6);
      poVar6[0xe0] = oVar4;
      poVar6[0xe1] = (ostream)0x1;
    }
    poVar6[0xe0] = (ostream)0x30;
    lVar2 = *(long *)poVar7;
    lVar3 = *(long *)(lVar2 + -0x18);
    *(uint *)(poVar7 + lVar3 + 0x18) = *(uint *)(poVar7 + lVar3 + 0x18) & 0xffffffb5 | 8;
    lVar2 = *(long *)(lVar2 + -0x18);
    *(uint *)(poVar7 + lVar2 + 0x18) = *(uint *)(poVar7 + lVar2 + 0x18) & 0xffffff4f | 0x80;
    (*sec->_vptr_section[0x13])(sec);
    poVar7 = std::ostream::_M_insert<unsigned_long>((ulong)poVar7);
    std::__ostream_insert<char,std::char_traits<char>>(poVar7," ",1);
    std::__ostream_insert<char,std::char_traits<char>>(poVar7,"0x",2);
    lVar2 = *(long *)poVar7;
    *(undefined8 *)(poVar7 + *(long *)(lVar2 + -0x18) + 0x10) = 2;
    lVar2 = *(long *)(lVar2 + -0x18);
    poVar6 = poVar7 + lVar2;
    if (poVar7[lVar2 + 0xe1] == (ostream)0x0) {
      oVar4 = (ostream)std::ios::widen((char)poVar6);
      poVar6[0xe0] = oVar4;
      poVar6[0xe1] = (ostream)0x1;
    }
    poVar6[0xe0] = (ostream)0x30;
    lVar2 = *(long *)poVar7;
    lVar3 = *(long *)(lVar2 + -0x18);
    *(uint *)(poVar7 + lVar3 + 0x18) = *(uint *)(poVar7 + lVar3 + 0x18) & 0xffffffb5 | 8;
    lVar2 = *(long *)(lVar2 + -0x18);
    *(uint *)(poVar7 + lVar2 + 0x18) = *(uint *)(poVar7 + lVar2 + 0x18) & 0xffffff4f | 0x80;
    (*sec->_vptr_section[0xf])(sec);
    poVar7 = std::ostream::_M_insert<unsigned_long>((ulong)poVar7);
    std::__ostream_insert<char,std::char_traits<char>>(poVar7," ",1);
    lVar2 = *(long *)poVar7;
    *(undefined8 *)(poVar7 + *(long *)(lVar2 + -0x18) + 0x10) = 3;
    lVar2 = *(long *)(lVar2 + -0x18);
    poVar6 = poVar7 + lVar2;
    if (poVar7[lVar2 + 0xe1] == (ostream)0x0) {
      oVar4 = (ostream)std::ios::widen((char)poVar6);
      poVar6[0xe0] = oVar4;
      poVar6[0xe1] = (ostream)0x1;
    }
    poVar6[0xe0] = (ostream)0x20;
    lVar2 = *(long *)poVar7;
    lVar3 = *(long *)(lVar2 + -0x18);
    *(uint *)(poVar7 + lVar3 + 0x18) = *(uint *)(poVar7 + lVar3 + 0x18) & 0xffffffb5 | 8;
    lVar2 = *(long *)(lVar2 + -0x18);
    *(uint *)(poVar7 + lVar2 + 0x18) = *(uint *)(poVar7 + lVar2 + 0x18) & 0xffffff4f | 0x20;
    iVar5 = (*sec->_vptr_section[7])(sec);
    section_flags_abi_cxx11_(&local_90,(dump *)CONCAT44(extraout_var,iVar5),flags);
    poVar7 = std::__ostream_insert<char,std::char_traits<char>>
                       (poVar7,(char *)CONCAT44(local_90._M_dataplus._M_p._4_4_,
                                                (int)local_90._M_dataplus._M_p),
                        local_90._M_string_length);
    std::__ostream_insert<char,std::char_traits<char>>(poVar7," ",1);
    std::__ostream_insert<char,std::char_traits<char>>(poVar7,"0x",2);
    lVar2 = *(long *)poVar7;
    *(undefined8 *)(poVar7 + *(long *)(lVar2 + -0x18) + 0x10) = 2;
    lVar2 = *(long *)(lVar2 + -0x18);
    poVar6 = poVar7 + lVar2;
    if (poVar7[lVar2 + 0xe1] == (ostream)0x0) {
      oVar4 = (ostream)std::ios::widen((char)poVar6);
      poVar6[0xe0] = oVar4;
      poVar6[0xe1] = (ostream)0x1;
    }
    poVar6[0xe0] = (ostream)0x30;
    lVar2 = *(long *)poVar7;
    lVar3 = *(long *)(lVar2 + -0x18);
    *(uint *)(poVar7 + lVar3 + 0x18) = *(uint *)(poVar7 + lVar3 + 0x18) & 0xffffffb5 | 8;
    lVar2 = *(long *)(lVar2 + -0x18);
    *(uint *)(poVar7 + lVar2 + 0x18) = *(uint *)(poVar7 + lVar2 + 0x18) & 0xffffff4f | 0x80;
    (*sec->_vptr_section[0xb])(sec);
    poVar7 = std::ostream::_M_insert<unsigned_long>((ulong)poVar7);
    std::__ostream_insert<char,std::char_traits<char>>(poVar7," ",1);
    std::__ostream_insert<char,std::char_traits<char>>(poVar7,"0x",2);
    lVar2 = *(long *)poVar7;
    *(undefined8 *)(poVar7 + *(long *)(lVar2 + -0x18) + 0x10) = 3;
    lVar2 = *(long *)(lVar2 + -0x18);
    poVar6 = poVar7 + lVar2;
    if (poVar7[lVar2 + 0xe1] == (ostream)0x0) {
      oVar4 = (ostream)std::ios::widen((char)poVar6);
      poVar6[0xe0] = oVar4;
      poVar6[0xe1] = (ostream)0x1;
    }
    poVar6[0xe0] = (ostream)0x30;
    lVar2 = *(long *)poVar7;
    lVar3 = *(long *)(lVar2 + -0x18);
    *(uint *)(poVar7 + lVar3 + 0x18) = *(uint *)(poVar7 + lVar3 + 0x18) & 0xffffffb5 | 8;
    lVar2 = *(long *)(lVar2 + -0x18);
    *(uint *)(poVar7 + lVar2 + 0x18) = *(uint *)(poVar7 + lVar2 + 0x18) & 0xffffff4f | 0x80;
    (*sec->_vptr_section[9])(sec);
    poVar7 = std::ostream::_M_insert<unsigned_long>((ulong)poVar7);
    std::__ostream_insert<char,std::char_traits<char>>(poVar7," ",1);
    std::__ostream_insert<char,std::char_traits<char>>(poVar7,"0x",2);
    lVar2 = *(long *)poVar7;
    *(undefined8 *)(poVar7 + *(long *)(lVar2 + -0x18) + 0x10) = 2;
    lVar2 = *(long *)(lVar2 + -0x18);
    poVar6 = poVar7 + lVar2;
    if (poVar7[lVar2 + 0xe1] == (ostream)0x0) {
      oVar4 = (ostream)std::ios::widen((char)poVar6);
      poVar6[0xe0] = oVar4;
      poVar6[0xe1] = (ostream)0x1;
    }
    poVar6[0xe0] = (ostream)0x30;
    lVar2 = *(long *)poVar7;
    lVar3 = *(long *)(lVar2 + -0x18);
    *(uint *)(poVar7 + lVar3 + 0x18) = *(uint *)(poVar7 + lVar3 + 0x18) & 0xffffffb5 | 8;
    lVar2 = *(long *)(lVar2 + -0x18);
    *(uint *)(poVar7 + lVar2 + 0x18) = *(uint *)(poVar7 + lVar2 + 0x18) & 0xffffff4f | 0x80;
    (*sec->_vptr_section[0xd])(sec);
    poVar7 = std::ostream::_M_insert<unsigned_long>((ulong)poVar7);
    std::__ostream_insert<char,std::char_traits<char>>(poVar7," ",1);
    lVar2 = *(long *)poVar7;
    *(undefined8 *)(poVar7 + *(long *)(lVar2 + -0x18) + 0x10) = 0x11;
    lVar2 = *(long *)(lVar2 + -0x18);
    poVar6 = poVar7 + lVar2;
    if (poVar7[lVar2 + 0xe1] == (ostream)0x0) {
      oVar4 = (ostream)std::ios::widen((char)poVar6);
      poVar6[0xe0] = oVar4;
      poVar6[0xe1] = (ostream)0x1;
    }
    poVar6[0xe0] = (ostream)0x20;
    lVar2 = *(long *)poVar7;
    lVar3 = *(long *)(lVar2 + -0x18);
    *(uint *)(poVar7 + lVar3 + 0x18) = *(uint *)(poVar7 + lVar3 + 0x18) & 0xffffffb5 | 8;
    lVar2 = *(long *)(lVar2 + -0x18);
    *(uint *)(poVar7 + lVar2 + 0x18) = *(uint *)(poVar7 + lVar2 + 0x18) & 0xffffff4f | 0x20;
    (*sec->_vptr_section[3])(&local_70,sec);
    poVar7 = std::__ostream_insert<char,std::char_traits<char>>(poVar7,(char *)local_70,local_68);
    std::__ostream_insert<char,std::char_traits<char>>(poVar7," ",1);
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar7 + -0x18) + (char)poVar7);
    std::ostream::put((char)poVar7);
    std::ostream::flush();
  }
  else {
    if (out[lVar2 + 0xe1] == (ostream)0x0) {
      oVar4 = (ostream)std::ios::widen((char)poVar7);
      poVar7[0xe0] = oVar4;
      poVar7[0xe1] = (ostream)0x1;
    }
    poVar7[0xe0] = (ostream)0x20;
    lVar2 = *(long *)out;
    lVar3 = *(long *)(lVar2 + -0x18);
    *(uint *)(out + lVar3 + 0x18) = *(uint *)(out + lVar3 + 0x18) & 0xffffffb5 | 2;
    lVar2 = *(long *)(lVar2 + -0x18);
    *(uint *)(out + lVar2 + 0x18) = *(uint *)(out + lVar2 + 0x18) & 0xffffff4f | 0x80;
    poVar6 = std::ostream::_M_insert<unsigned_long>((ulong)out);
    std::__ostream_insert<char,std::char_traits<char>>(poVar6,"] ",2);
    lVar2 = *(long *)poVar6;
    *(undefined8 *)(poVar6 + *(long *)(lVar2 + -0x18) + 0x10) = 0x11;
    lVar2 = *(long *)(lVar2 + -0x18);
    poVar7 = poVar6 + lVar2;
    if (poVar6[lVar2 + 0xe1] == (ostream)0x0) {
      oVar4 = (ostream)std::ios::widen((char)poVar7);
      poVar7[0xe0] = oVar4;
      poVar7[0xe1] = (ostream)0x1;
    }
    poVar7[0xe0] = (ostream)0x20;
    lVar2 = *(long *)poVar6;
    puVar8 = *(uint **)(lVar2 + -0x18);
    *(uint *)(poVar6 + 0x18 + (long)puVar8) =
         *(uint *)(poVar6 + 0x18 + (long)puVar8) & 0xffffffb5 | 8;
    lVar2 = *(long *)(lVar2 + -0x18);
    *(uint *)(poVar6 + lVar2 + 0x18) = *(uint *)(poVar6 + lVar2 + 0x18) & 0xffffff4f | 0x20;
    local_90._M_dataplus._M_p._0_4_ = (*sec->_vptr_section[5])(sec);
    format_assoc<ELFIO::section_type_table_t[33],unsigned_int>
              (&local_50,(dump *)section_type_table,(section_type_table_t (*) [33])&local_90,puVar8)
    ;
    poVar7 = std::__ostream_insert<char,std::char_traits<char>>
                       (poVar6,local_50._M_dataplus._M_p,local_50._M_string_length);
    std::__ostream_insert<char,std::char_traits<char>>(poVar7," ",1);
    std::__ostream_insert<char,std::char_traits<char>>(poVar7,"0x",2);
    lVar2 = *(long *)poVar7;
    *(undefined8 *)(poVar7 + *(long *)(lVar2 + -0x18) + 0x10) = 0x10;
    lVar2 = *(long *)(lVar2 + -0x18);
    poVar6 = poVar7 + lVar2;
    if (poVar7[lVar2 + 0xe1] == (ostream)0x0) {
      oVar4 = (ostream)std::ios::widen((char)poVar6);
      poVar6[0xe0] = oVar4;
      poVar6[0xe1] = (ostream)0x1;
    }
    poVar6[0xe0] = (ostream)0x30;
    lVar2 = *(long *)poVar7;
    lVar3 = *(long *)(lVar2 + -0x18);
    *(uint *)(poVar7 + lVar3 + 0x18) = *(uint *)(poVar7 + lVar3 + 0x18) & 0xffffffb5 | 8;
    lVar2 = *(long *)(lVar2 + -0x18);
    *(uint *)(poVar7 + lVar2 + 0x18) = *(uint *)(poVar7 + lVar2 + 0x18) & 0xffffff4f | 0x80;
    (*sec->_vptr_section[0x11])(sec);
    poVar7 = std::ostream::_M_insert<unsigned_long>((ulong)poVar7);
    std::__ostream_insert<char,std::char_traits<char>>(poVar7," ",1);
    std::__ostream_insert<char,std::char_traits<char>>(poVar7,"0x",2);
    lVar2 = *(long *)poVar7;
    *(undefined8 *)(poVar7 + *(long *)(lVar2 + -0x18) + 0x10) = 0x10;
    lVar2 = *(long *)(lVar2 + -0x18);
    poVar6 = poVar7 + lVar2;
    if (poVar7[lVar2 + 0xe1] == (ostream)0x0) {
      oVar4 = (ostream)std::ios::widen((char)poVar6);
      poVar6[0xe0] = oVar4;
      poVar6[0xe1] = (ostream)0x1;
    }
    poVar6[0xe0] = (ostream)0x30;
    lVar2 = *(long *)poVar7;
    lVar3 = *(long *)(lVar2 + -0x18);
    *(uint *)(poVar7 + lVar3 + 0x18) = *(uint *)(poVar7 + lVar3 + 0x18) & 0xffffffb5 | 8;
    lVar2 = *(long *)(lVar2 + -0x18);
    *(uint *)(poVar7 + lVar2 + 0x18) = *(uint *)(poVar7 + lVar2 + 0x18) & 0xffffff4f | 0x80;
    (*sec->_vptr_section[0x13])(sec);
    poVar7 = std::ostream::_M_insert<unsigned_long>((ulong)poVar7);
    std::__ostream_insert<char,std::char_traits<char>>(poVar7," ",1);
    std::__ostream_insert<char,std::char_traits<char>>(poVar7,"0x",2);
    lVar2 = *(long *)poVar7;
    *(undefined8 *)(poVar7 + *(long *)(lVar2 + -0x18) + 0x10) = 8;
    lVar2 = *(long *)(lVar2 + -0x18);
    poVar6 = poVar7 + lVar2;
    if (poVar7[lVar2 + 0xe1] == (ostream)0x0) {
      oVar4 = (ostream)std::ios::widen((char)poVar6);
      poVar6[0xe0] = oVar4;
      poVar6[0xe1] = (ostream)0x1;
    }
    poVar6[0xe0] = (ostream)0x30;
    lVar2 = *(long *)poVar7;
    lVar3 = *(long *)(lVar2 + -0x18);
    *(uint *)(poVar7 + lVar3 + 0x18) = *(uint *)(poVar7 + lVar3 + 0x18) & 0xffffffb5 | 8;
    lVar2 = *(long *)(lVar2 + -0x18);
    *(uint *)(poVar7 + lVar2 + 0x18) = *(uint *)(poVar7 + lVar2 + 0x18) & 0xffffff4f | 0x80;
    (*sec->_vptr_section[0x17])(sec);
    poVar7 = std::ostream::_M_insert<unsigned_long>((ulong)poVar7);
    std::__ostream_insert<char,std::char_traits<char>>(poVar7," ",1);
    lVar2 = *(long *)poVar7;
    *(undefined8 *)(poVar7 + *(long *)(lVar2 + -0x18) + 0x10) = 3;
    lVar2 = *(long *)(lVar2 + -0x18);
    poVar6 = poVar7 + lVar2;
    if (poVar7[lVar2 + 0xe1] == (ostream)0x0) {
      oVar4 = (ostream)std::ios::widen((char)poVar6);
      poVar6[0xe0] = oVar4;
      poVar6[0xe1] = (ostream)0x1;
    }
    poVar6[0xe0] = (ostream)0x20;
    lVar2 = *(long *)poVar7;
    lVar3 = *(long *)(lVar2 + -0x18);
    *(uint *)(poVar7 + lVar3 + 0x18) = *(uint *)(poVar7 + lVar3 + 0x18) & 0xffffffb5 | 8;
    lVar2 = *(long *)(lVar2 + -0x18);
    *(uint *)(poVar7 + lVar2 + 0x18) = *(uint *)(poVar7 + lVar2 + 0x18) & 0xffffff4f | 0x20;
    iVar5 = (*sec->_vptr_section[7])(sec);
    section_flags_abi_cxx11_(&local_90,(dump *)CONCAT44(extraout_var_00,iVar5),flags_00);
    poVar7 = std::__ostream_insert<char,std::char_traits<char>>
                       (poVar7,(char *)CONCAT44(local_90._M_dataplus._M_p._4_4_,
                                                (int)local_90._M_dataplus._M_p),
                        local_90._M_string_length);
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar7 + -0x18) + (char)poVar7);
    std::ostream::put((char)poVar7);
    poVar6 = (ostream *)std::ostream::flush();
    lVar2 = *(long *)poVar6;
    *(undefined8 *)(poVar6 + *(long *)(lVar2 + -0x18) + 0x10) = 8;
    lVar2 = *(long *)(lVar2 + -0x18);
    poVar7 = poVar6 + lVar2;
    if (poVar6[lVar2 + 0xe1] == (ostream)0x0) {
      oVar4 = (ostream)std::ios::widen((char)poVar7);
      poVar7[0xe0] = oVar4;
      poVar7[0xe1] = (ostream)0x1;
    }
    poVar7[0xe0] = (ostream)0x20;
    lVar2 = *(long *)poVar6;
    lVar3 = *(long *)(lVar2 + -0x18);
    *(uint *)(poVar6 + lVar3 + 0x18) = *(uint *)(poVar6 + lVar3 + 0x18) & 0xffffffb5 | 8;
    lVar2 = *(long *)(lVar2 + -0x18);
    *(uint *)(poVar6 + lVar2 + 0x18) = *(uint *)(poVar6 + lVar2 + 0x18) & 0xffffff4f | 0x20;
    std::__ostream_insert<char,std::char_traits<char>>(poVar6," ",1);
    std::__ostream_insert<char,std::char_traits<char>>(poVar6,"0x",2);
    lVar2 = *(long *)poVar6;
    *(undefined8 *)(poVar6 + *(long *)(lVar2 + -0x18) + 0x10) = 4;
    lVar2 = *(long *)(lVar2 + -0x18);
    poVar7 = poVar6 + lVar2;
    if (poVar6[lVar2 + 0xe1] == (ostream)0x0) {
      oVar4 = (ostream)std::ios::widen((char)poVar7);
      poVar7[0xe0] = oVar4;
      poVar7[0xe1] = (ostream)0x1;
    }
    poVar7[0xe0] = (ostream)0x30;
    lVar2 = *(long *)poVar6;
    lVar3 = *(long *)(lVar2 + -0x18);
    *(uint *)(poVar6 + lVar3 + 0x18) = *(uint *)(poVar6 + lVar3 + 0x18) & 0xffffffb5 | 8;
    lVar2 = *(long *)(lVar2 + -0x18);
    *(uint *)(poVar6 + lVar2 + 0x18) = *(uint *)(poVar6 + lVar2 + 0x18) & 0xffffff4f | 0x80;
    (*sec->_vptr_section[0xf])(sec);
    poVar7 = std::ostream::_M_insert<unsigned_long>((ulong)poVar6);
    std::__ostream_insert<char,std::char_traits<char>>(poVar7," ",1);
    std::__ostream_insert<char,std::char_traits<char>>(poVar7,"0x",2);
    lVar2 = *(long *)poVar7;
    *(undefined8 *)(poVar7 + *(long *)(lVar2 + -0x18) + 0x10) = 4;
    lVar2 = *(long *)(lVar2 + -0x18);
    poVar6 = poVar7 + lVar2;
    if (poVar7[lVar2 + 0xe1] == (ostream)0x0) {
      oVar4 = (ostream)std::ios::widen((char)poVar6);
      poVar6[0xe0] = oVar4;
      poVar6[0xe1] = (ostream)0x1;
    }
    poVar6[0xe0] = (ostream)0x30;
    lVar2 = *(long *)poVar7;
    lVar3 = *(long *)(lVar2 + -0x18);
    *(uint *)(poVar7 + lVar3 + 0x18) = *(uint *)(poVar7 + lVar3 + 0x18) & 0xffffffb5 | 8;
    lVar2 = *(long *)(lVar2 + -0x18);
    *(uint *)(poVar7 + lVar2 + 0x18) = *(uint *)(poVar7 + lVar2 + 0x18) & 0xffffff4f | 0x80;
    (*sec->_vptr_section[0xb])(sec);
    poVar7 = std::ostream::_M_insert<unsigned_long>((ulong)poVar7);
    std::__ostream_insert<char,std::char_traits<char>>(poVar7," ",1);
    std::__ostream_insert<char,std::char_traits<char>>(poVar7,"0x",2);
    lVar2 = *(long *)poVar7;
    *(undefined8 *)(poVar7 + *(long *)(lVar2 + -0x18) + 0x10) = 4;
    lVar2 = *(long *)(lVar2 + -0x18);
    poVar6 = poVar7 + lVar2;
    if (poVar7[lVar2 + 0xe1] == (ostream)0x0) {
      oVar4 = (ostream)std::ios::widen((char)poVar6);
      poVar6[0xe0] = oVar4;
      poVar6[0xe1] = (ostream)0x1;
    }
    poVar6[0xe0] = (ostream)0x30;
    lVar2 = *(long *)poVar7;
    lVar3 = *(long *)(lVar2 + -0x18);
    *(uint *)(poVar7 + lVar3 + 0x18) = *(uint *)(poVar7 + lVar3 + 0x18) & 0xffffffb5 | 8;
    lVar2 = *(long *)(lVar2 + -0x18);
    *(uint *)(poVar7 + lVar2 + 0x18) = *(uint *)(poVar7 + lVar2 + 0x18) & 0xffffff4f | 0x80;
    (*sec->_vptr_section[9])(sec);
    poVar7 = std::ostream::_M_insert<unsigned_long>((ulong)poVar7);
    std::__ostream_insert<char,std::char_traits<char>>(poVar7," ",1);
    std::__ostream_insert<char,std::char_traits<char>>(poVar7,"0x",2);
    lVar2 = *(long *)poVar7;
    *(undefined8 *)(poVar7 + *(long *)(lVar2 + -0x18) + 0x10) = 4;
    lVar2 = *(long *)(lVar2 + -0x18);
    poVar6 = poVar7 + lVar2;
    if (poVar7[lVar2 + 0xe1] == (ostream)0x0) {
      oVar4 = (ostream)std::ios::widen((char)poVar6);
      poVar6[0xe0] = oVar4;
      poVar6[0xe1] = (ostream)0x1;
    }
    poVar6[0xe0] = (ostream)0x30;
    lVar2 = *(long *)poVar7;
    lVar3 = *(long *)(lVar2 + -0x18);
    *(uint *)(poVar7 + lVar3 + 0x18) = *(uint *)(poVar7 + lVar3 + 0x18) & 0xffffffb5 | 8;
    lVar2 = *(long *)(lVar2 + -0x18);
    *(uint *)(poVar7 + lVar2 + 0x18) = *(uint *)(poVar7 + lVar2 + 0x18) & 0xffffff4f | 0x80;
    (*sec->_vptr_section[0xd])(sec);
    poVar7 = std::ostream::_M_insert<unsigned_long>((ulong)poVar7);
    std::__ostream_insert<char,std::char_traits<char>>(poVar7,"   ",3);
    lVar2 = *(long *)poVar7;
    *(undefined8 *)(poVar7 + *(long *)(lVar2 + -0x18) + 0x10) = 0x11;
    lVar2 = *(long *)(lVar2 + -0x18);
    poVar6 = poVar7 + lVar2;
    if (poVar7[lVar2 + 0xe1] == (ostream)0x0) {
      oVar4 = (ostream)std::ios::widen((char)poVar6);
      poVar6[0xe0] = oVar4;
      poVar6[0xe1] = (ostream)0x1;
    }
    poVar6[0xe0] = (ostream)0x20;
    lVar2 = *(long *)poVar7;
    lVar3 = *(long *)(lVar2 + -0x18);
    *(uint *)(poVar7 + lVar3 + 0x18) = *(uint *)(poVar7 + lVar3 + 0x18) & 0xffffffb5 | 8;
    lVar2 = *(long *)(lVar2 + -0x18);
    *(uint *)(poVar7 + lVar2 + 0x18) = *(uint *)(poVar7 + lVar2 + 0x18) & 0xffffff4f | 0x20;
    (*sec->_vptr_section[3])(&local_70,sec);
    poVar7 = std::__ostream_insert<char,std::char_traits<char>>(poVar7,(char *)local_70,local_68);
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar7 + -0x18) + (char)poVar7);
    std::ostream::put((char)poVar7);
    std::ostream::flush();
  }
  if (local_70 != local_60) {
    operator_delete(local_70,local_60[0] + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)CONCAT44(local_90._M_dataplus._M_p._4_4_,(int)local_90._M_dataplus._M_p) !=
      &local_90.field_2) {
    operator_delete((undefined1 *)
                    CONCAT44(local_90._M_dataplus._M_p._4_4_,(int)local_90._M_dataplus._M_p),
                    local_90.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_50._M_dataplus._M_p != &local_50.field_2) {
    operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
  }
  *(undefined4 *)(out + *(long *)(*(long *)out + -0x18) + 0x18) = uVar1;
  return;
}

Assistant:

static void section_header( std::ostream&  out,
                                Elf_Half       no,
                                const section* sec,
                                unsigned char  elf_class )
    {
        std::ios_base::fmtflags original_flags = out.flags();

        // clang-format off
        if ( elf_class == ELFCLASS32 ) { // Output for 32-bit
            out << "[" << DUMP_DEC_FORMAT( 5 ) << no << "] "
                << DUMP_STR_FORMAT( 17 ) << str_section_type( sec->get_type() )
                << " " << DUMP_HEX0x_FORMAT( 8 ) << sec->get_address() << " "
                << DUMP_HEX0x_FORMAT( 8 ) << sec->get_size() << " "
                << DUMP_HEX0x_FORMAT( 2 ) << sec->get_entry_size() << " "
                << DUMP_STR_FORMAT( 3 ) << section_flags( sec->get_flags() )
                << " " << DUMP_HEX0x_FORMAT( 2 ) << sec->get_link() << " "
                << DUMP_HEX0x_FORMAT( 3 ) << sec->get_info() << " "
                << DUMP_HEX0x_FORMAT( 2 ) << sec->get_addr_align() << " "
                << DUMP_STR_FORMAT( 17 ) << sec->get_name() << " " << std::endl;
        }
        else { // Output for 64-bit
            out << "[" << DUMP_DEC_FORMAT( 5 ) << no << "] "
                << DUMP_STR_FORMAT( 17 ) << str_section_type( sec->get_type() ) << " "
                << DUMP_HEX0x_FORMAT( 16 ) << sec->get_address()                  << " "
                << DUMP_HEX0x_FORMAT( 16 ) << sec->get_size()                     << " "
                << DUMP_HEX0x_FORMAT(  8 ) << sec->get_offset()                   << " "
                << DUMP_STR_FORMAT(  3) << section_flags( sec->get_flags() )
                << std::endl
                << DUMP_STR_FORMAT( 8 ) << " "
                << DUMP_HEX0x_FORMAT( 4 ) << sec->get_entry_size() << " "
                << DUMP_HEX0x_FORMAT( 4 ) << sec->get_link()       << " "
                << DUMP_HEX0x_FORMAT( 4 ) << sec->get_info()       << " "
                << DUMP_HEX0x_FORMAT( 4 ) << sec->get_addr_align() << "   "
                << DUMP_STR_FORMAT( 17 ) << sec->get_name()
                << std::endl;
        }
        // clang-format on

        out.flags( original_flags );

        return;
    }